

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3rbu_bp_progress(sqlite3rbu *p,int *pnOne,int *pnTwo)

{
  int iVar1;
  
  switch(p->eStage) {
  case 1:
    if (p->nPhaseOneStep < 1) {
      iVar1 = -1;
    }
    else {
      iVar1 = (int)(((long)p->nProgress * 10000) / p->nPhaseOneStep);
    }
    *pnOne = iVar1;
    goto LAB_0012c444;
  case 2:
    *pnOne = 10000;
LAB_0012c444:
    iVar1 = 0;
    break;
  default:
    goto switchD_0012c3eb_caseD_3;
  case 4:
    *pnOne = 10000;
    iVar1 = (int)(((long)p->nStep * 10000) / (long)p->nFrame);
    break;
  case 5:
    *pnOne = 10000;
    iVar1 = 10000;
  }
  *pnTwo = iVar1;
switchD_0012c3eb_caseD_3:
  return;
}

Assistant:

SQLITE_API void sqlite3rbu_bp_progress(sqlite3rbu *p, int *pnOne, int *pnTwo){
  const int MAX_PROGRESS = 10000;
  switch( p->eStage ){
    case RBU_STAGE_OAL:
      if( p->nPhaseOneStep>0 ){
        *pnOne = (int)(MAX_PROGRESS * (i64)p->nProgress/(i64)p->nPhaseOneStep);
      }else{
        *pnOne = -1;
      }
      *pnTwo = 0;
      break;

    case RBU_STAGE_MOVE:
      *pnOne = MAX_PROGRESS;
      *pnTwo = 0;
      break;

    case RBU_STAGE_CKPT:
      *pnOne = MAX_PROGRESS;
      *pnTwo = (int)(MAX_PROGRESS * (i64)p->nStep / (i64)p->nFrame);
      break;

    case RBU_STAGE_DONE:
      *pnOne = MAX_PROGRESS;
      *pnTwo = MAX_PROGRESS;
      break;

    default:
      assert( 0 );
  }
}